

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_block.cpp
# Opt level: O0

void msd_D<1024u>(uchar **strings,size_t n,size_t depth)

{
  uchar *puVar1;
  value_type ppuVar2;
  value_type pppuVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t sVar9;
  bool bVar10;
  int iVar11;
  reference pvVar12;
  reference pvVar13;
  reference pppuVar14;
  reference ppppuVar15;
  unsigned_long *puVar16;
  ulong __n;
  reference pppuVar17;
  uint local_924;
  Block ppuStack_920;
  uint i_5;
  Block tmp;
  size_t block_overlap;
  unsigned_long local_908;
  unsigned_long local_900;
  size_t block_items;
  size_t bucket_pos;
  _List_const_iterator<unsigned_char_**> local_8e8;
  const_iterator it;
  value_type vStack_8d8;
  uint i_4;
  size_t pos;
  Block b_1;
  Block ppuStack_8c0;
  uchar c_1;
  Block b;
  uint local_8b0;
  uint uStack_8ac;
  uchar c;
  uint j_1;
  uint j;
  uchar cache [32];
  ulong local_880;
  size_t i;
  ulong local_870;
  size_t i_3;
  ulong local_860;
  size_t i_2;
  undefined1 local_850 [4];
  uint i_1;
  array<unsigned_long,_256UL> bucketsize;
  allocator<unsigned_char_***> local_39;
  undefined1 local_38 [8];
  BackLinks backlinks;
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)depth;
  if (n < 0x10000) {
    msd_CE2_16bit(strings,n,depth);
  }
  else {
    if (n < 0x401) {
      __assert_fail("n > B",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                    ,0x55,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
    }
    if ((msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_ == '\0') &&
       (iVar11 = __cxa_guard_acquire(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                      buckets_abi_cxx11_), iVar11 != 0)) {
      std::array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>::
      array(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_);
      __cxa_atexit(std::
                   array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                   ::~array,&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                             buckets_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                           buckets_abi_cxx11_);
    }
    if ((msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_ == '\0')
       && (iVar11 = __cxa_guard_acquire(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                         freeblocks_abi_cxx11_), iVar11 != 0)) {
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::list
                (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_);
      __cxa_atexit(std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::~list,
                   &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                           freeblocks_abi_cxx11_);
    }
    std::allocator<unsigned_char_***>::allocator(&local_39);
    std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::vector
              ((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)local_38,
               (n >> 10) + 1,&local_39);
    std::allocator<unsigned_char_***>::~allocator(&local_39);
    for (i_2._4_4_ = 0; i_2._4_4_ < 0x100; i_2._4_4_ = i_2._4_4_ + 1) {
      pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                          ((array<unsigned_long,_256UL> *)local_850,(ulong)i_2._4_4_);
      *pvVar12 = 0;
      pvVar13 = std::
                array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                ::operator[](&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                              buckets_abi_cxx11_,(ulong)i_2._4_4_);
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear(pvVar13);
    }
    for (local_860 = 0; local_860 < 0x106; local_860 = local_860 + 1) {
      i_3 = (size_t)std::array<unsigned_char_*,_268288UL>::operator[]
                              (&msd_D<1024U>::temp_space,local_860 << 10);
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_,
                 (value_type *)&i_3);
    }
    for (local_870 = 0; local_870 < n - 0x400; local_870 = local_870 + 0x400) {
      i = (size_t)(strings + local_870);
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_,
                 (value_type *)&i);
    }
    for (local_880 = 0; local_880 < n - (n & 0x1f); local_880 = local_880 + 0x20) {
      for (uStack_8ac = 0; uStack_8ac < 0x20; uStack_8ac = uStack_8ac + 1) {
        *(uchar *)((long)&j_1 + (ulong)uStack_8ac) =
             strings[local_880 + uStack_8ac]
             [(long)backlinks.
                    super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage];
      }
      for (local_8b0 = 0; local_8b0 < 0x20; local_8b0 = local_8b0 + 1) {
        b._7_1_ = *(byte *)((long)&j_1 + (ulong)local_8b0);
        pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                            ((array<unsigned_long,_256UL> *)local_850,(ulong)b._7_1_);
        if ((*pvVar12 & 0x3ff) == 0) {
          ppuStack_8c0 = take_free_block(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)
                                          ::freeblocks_abi_cxx11_);
          pvVar13 = std::
                    array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                    ::operator[](&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                  buckets_abi_cxx11_,(ulong)b._7_1_);
          std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                    (pvVar13,&stack0xfffffffffffff740);
          if ((strings <= ppuStack_8c0) && (ppuStack_8c0 < strings + n)) {
            pvVar13 = std::
                      array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                      ::operator[](&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                    buckets_abi_cxx11_,(ulong)b._7_1_);
            pppuVar14 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::
                        back(pvVar13);
            auVar4._8_8_ = (long)ppuStack_8c0 - (long)strings >> 0x3f;
            auVar4._0_8_ = (long)ppuStack_8c0 - (long)strings >> 3;
            ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                         operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *
                                    )local_38,SUB168(auVar4 / SEXT816(0x400),0));
            *ppppuVar15 = pppuVar14;
          }
        }
        pvVar13 = std::
                  array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                  ::operator[](&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                buckets_abi_cxx11_,(ulong)b._7_1_);
        bVar10 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::empty
                           (pvVar13);
        if (((bVar10 ^ 0xffU) & 1) == 0) {
          __assert_fail("not buckets[c].empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                        ,0x7a,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
        }
        puVar1 = strings[local_880 + local_8b0];
        pvVar13 = std::
                  array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                  ::operator[](&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                buckets_abi_cxx11_,(ulong)b._7_1_);
        pppuVar14 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::back
                              (pvVar13);
        ppuVar2 = *pppuVar14;
        pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                            ((array<unsigned_long,_256UL> *)local_850,(ulong)b._7_1_);
        ppuVar2[*pvVar12 & 0x3ff] = puVar1;
        pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                            ((array<unsigned_long,_256UL> *)local_850,(ulong)b._7_1_);
        *pvVar12 = *pvVar12 + 1;
      }
    }
    for (; local_880 < n; local_880 = local_880 + 1) {
      b_1._7_1_ = strings[local_880]
                  [(long)backlinks.
                         super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage];
      pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                          ((array<unsigned_long,_256UL> *)local_850,(ulong)b_1._7_1_);
      if ((*pvVar12 & 0x3ff) == 0) {
        pos = (size_t)take_free_block(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                       freeblocks_abi_cxx11_);
        pvVar13 = std::
                  array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                  ::operator[](&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                buckets_abi_cxx11_,(ulong)b_1._7_1_);
        std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                  (pvVar13,(value_type *)&pos);
        if ((strings <= pos) && (pos < strings + n)) {
          pvVar13 = std::
                    array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                    ::operator[](&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                  buckets_abi_cxx11_,(ulong)b_1._7_1_);
          pppuVar14 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::back
                                (pvVar13);
          auVar5._8_8_ = (long)(pos - (long)strings) >> 0x3f;
          auVar5._0_8_ = (long)(pos - (long)strings) >> 3;
          ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                       operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)
                                  local_38,SUB168(auVar5 / SEXT816(0x400),0));
          *ppppuVar15 = pppuVar14;
        }
      }
      pvVar13 = std::
                array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                ::operator[](&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                              buckets_abi_cxx11_,(ulong)b_1._7_1_);
      bVar10 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::empty
                         (pvVar13);
      if (((bVar10 ^ 0xffU) & 1) == 0) {
        __assert_fail("not buckets[c].empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                      ,0x88,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
      }
      puVar1 = strings[local_880];
      pvVar13 = std::
                array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                ::operator[](&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                              buckets_abi_cxx11_,(ulong)b_1._7_1_);
      pppuVar14 = std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::back
                            (pvVar13);
      ppuVar2 = *pppuVar14;
      pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                          ((array<unsigned_long,_256UL> *)local_850,(ulong)b_1._7_1_);
      ppuVar2[*pvVar12 & 0x3ff] = puVar1;
      pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                          ((array<unsigned_long,_256UL> *)local_850,(ulong)b_1._7_1_);
      *pvVar12 = *pvVar12 + 1;
    }
    vStack_8d8 = 0;
    for (it._M_node._4_4_ = 0; it._M_node._4_4_ < 0x100; it._M_node._4_4_ = it._M_node._4_4_ + 1) {
      pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                          ((array<unsigned_long,_256UL> *)local_850,(ulong)it._M_node._4_4_);
      if (*pvVar12 != 0) {
        pvVar13 = std::
                  array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                  ::operator[](&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                buckets_abi_cxx11_,(ulong)it._M_node._4_4_);
        bucket_pos = (size_t)std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ::begin(pvVar13);
        std::_List_const_iterator<unsigned_char_**>::_List_const_iterator
                  (&local_8e8,(iterator *)&bucket_pos);
        for (block_items = 0; sVar9 = block_items,
            pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                                ((array<unsigned_long,_256UL> *)local_850,(ulong)it._M_node._4_4_),
            sVar9 < *pvVar12; block_items = block_items + 0x400) {
          local_908 = 0x400;
          pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                              ((array<unsigned_long,_256UL> *)local_850,(ulong)it._M_node._4_4_);
          block_overlap = *pvVar12 - block_items;
          puVar16 = std::min<unsigned_long>(&local_908,&block_overlap);
          local_900 = *puVar16;
          __n = (vStack_8d8 + local_900) - 1 >> 10;
          pppuVar17 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_8e8);
          if (*pppuVar17 == strings + vStack_8d8) {
            if ((vStack_8d8 & 0x3ff) != 0) {
              __assert_fail("pos%B==0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                            ,0x9b,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
            }
            ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                         operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *
                                    )local_38,vStack_8d8 >> 10);
            *ppppuVar15 = (value_type)0x0;
          }
          else {
            ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                         operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *
                                    )local_38,__n);
            if (*ppppuVar15 != (value_type)0x0) {
              ppuStack_920 = take_free_block(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)
                                              ::freeblocks_abi_cxx11_);
              while (strings <= ppuStack_920 && ppuStack_920 < strings + vStack_8d8) {
                ppuStack_920 = take_free_block(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)
                                                ::freeblocks_abi_cxx11_);
              }
              if ((strings <= ppuStack_920) && (ppuStack_920 < strings + n)) {
                auVar6._8_8_ = (long)ppuStack_920 - (long)strings >> 0x3f;
                auVar6._0_8_ = (long)ppuStack_920 - (long)strings >> 3;
                ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                             operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                         *)local_38,SUB168(auVar6 / SEXT816(0x400),0));
                if (*ppppuVar15 != (value_type)0x0) {
                  __assert_fail("backlinks[(tmp-strings)/B]==0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                                ,0xac,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
                }
                ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                             operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                         *)local_38,__n);
                pppuVar3 = *ppppuVar15;
                auVar7._8_8_ = (long)ppuStack_920 - (long)strings >> 0x3f;
                auVar7._0_8_ = (long)ppuStack_920 - (long)strings >> 3;
                ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                             operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                         *)local_38,SUB168(auVar7 / SEXT816(0x400),0));
                *ppppuVar15 = pppuVar3;
              }
              ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                           operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                       *)local_38,__n);
              memcpy(ppuStack_920,**ppppuVar15,0x2000);
              ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                           operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                       *)local_38,__n);
              **ppppuVar15 = ppuStack_920;
              ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                           operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                       *)local_38,__n);
              *ppppuVar15 = (value_type)0x0;
            }
            pppuVar17 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_8e8);
            if ((strings <= *pppuVar17) &&
               (pppuVar17 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_8e8),
               *pppuVar17 < strings + n)) {
              pppuVar17 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_8e8);
              if (*pppuVar17 <= strings + vStack_8d8) {
                __assert_fail("*it > strings+pos",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                              ,0xb5,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
              }
              pppuVar17 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_8e8);
              auVar8._8_8_ = (long)*pppuVar17 - (long)strings >> 0x3f;
              auVar8._0_8_ = (long)*pppuVar17 - (long)strings >> 3;
              ppppuVar15 = std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::
                           operator[]((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                                       *)local_38,SUB168(auVar8 / SEXT816(0x400),0));
              *ppppuVar15 = (value_type)0x0;
            }
            pppuVar17 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_8e8);
            memcpy(strings + vStack_8d8,*pppuVar17,local_900 << 3);
            pppuVar17 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_8e8);
            if ((*pppuVar17 < strings) ||
               (pppuVar17 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_8e8),
               strings + n <= *pppuVar17)) {
              pppuVar17 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_8e8);
              std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_front
                        (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                          freeblocks_abi_cxx11_,pppuVar17);
            }
            else {
              pppuVar17 = std::_List_const_iterator<unsigned_char_**>::operator*(&local_8e8);
              std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                        (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                          freeblocks_abi_cxx11_,pppuVar17);
            }
          }
          vStack_8d8 = local_900 + vStack_8d8;
          std::_List_const_iterator<unsigned_char_**>::operator++(&local_8e8);
        }
      }
    }
    std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear
              (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_);
    std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::clear
              ((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)local_38);
    pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                        ((array<unsigned_long,_256UL> *)local_850,0);
    vStack_8d8 = *pvVar12;
    for (local_924 = 1; local_924 < 0x100; local_924 = local_924 + 1) {
      pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                          ((array<unsigned_long,_256UL> *)local_850,(ulong)local_924);
      if (*pvVar12 != 0) {
        pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                            ((array<unsigned_long,_256UL> *)local_850,(ulong)local_924);
        msd_D<1024u>(strings + vStack_8d8,*pvVar12,
                     (long)backlinks.
                           super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        pvVar12 = std::array<unsigned_long,_256UL>::operator[]
                            ((array<unsigned_long,_256UL> *)local_850,(ulong)local_924);
        vStack_8d8 = *pvVar12 + vStack_8d8;
      }
    }
    std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::~vector
              ((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)local_38);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 0x10000) {
		msd_CE2_16bit(strings, n, depth);
		return;
	}
	assert(n > B);
	static Buckets buckets;
	static std::array<unsigned char*, (256+6)*B> temp_space;
	static FreeBlocks freeblocks;
	BackLinks backlinks(n/B+1);
	std::array<size_t, 256> bucketsize;

	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = 0;
		buckets[i].clear();
	}

	// Initialize our list of free blocks.
	for (size_t i=0; i < 256+6; ++i)
		freeblocks.push_back(&temp_space[i*B]);
	for (size_t i=0; i < n-B; i+=B)
		freeblocks.push_back(&strings[i]);

	// Distribute strings to buckets. Use a small cache to reduce memory
	// stalls. The exact size of the cache is not very important.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			const unsigned char c = cache[j];
			if (bucketsize[c] % B == 0) {
				Block b = take_free_block(freeblocks);
				buckets[c].push_back(b);
				// Backlinks must be set for those blocks, that
				// use the original string array space.
				if (b >= strings && b < strings+n) {
					backlinks[(b-strings)/B] = &(buckets[c].back());
				}
			}
			assert(not buckets[c].empty());
			buckets[c].back()[bucketsize[c] % B] = strings[i+j];
			++bucketsize[c];
		}
	}
	for (; i < n; ++i) {
		const unsigned char c = strings[i][depth];
		if (bucketsize[c] % B == 0) {
			Block b = take_free_block(freeblocks);
			buckets[c].push_back(b);
			if (b >= strings && b < strings+n) {
				backlinks[(b-strings)/B] = &(buckets[c].back());
			}
		}
		assert(not buckets[c].empty());
		buckets[c].back()[bucketsize[c] % B] = strings[i];
		++bucketsize[c];
	}

	// Process each bucket, and copy all strings in that bucket to proper
	// place in the original string pointer array. This means that those
	// positions that are occupied by other blocks must be moved to free
	// space etc.
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;

		Bucket::const_iterator it = buckets[i].begin();
		for (size_t bucket_pos=0; bucket_pos < bucketsize[i]; ++it, bucket_pos+=B) {
			const size_t block_items = std::min(size_t(B), bucketsize[i]-bucket_pos);
			const size_t block_overlap = (pos+block_items-1)/B;

			if (*it == (strings+pos)) {
				assert(pos%B==0);
				backlinks[pos/B] = 0;
				pos += block_items;
				continue;
			}

			// Don't overwrite the block in the position we are
			// about to write to, but copy it into safety.
			if (backlinks[block_overlap]) {
				// Take a free block. The block can be 'stale',
				// i.e. it can point to positions we have
				// already copied new strings into. Take free
				// blocks until we have non-stale block.
				Block tmp = take_free_block(freeblocks);
				while (tmp >= strings && tmp < strings+pos)
					tmp = take_free_block(freeblocks);
				if (tmp >= strings && tmp < strings+n) {
					assert(backlinks[(tmp-strings)/B]==0);
					backlinks[(tmp-strings)/B] = backlinks[block_overlap];
				}
				memcpy(tmp, *(backlinks[block_overlap]), B*sizeof(unsigned char*));
				*(backlinks[block_overlap]) = tmp;
				backlinks[block_overlap] = 0;
			}

			if (*it >= strings && *it < strings+n) {
				assert(*it > strings+pos);
				backlinks[(*it-strings)/B] = 0;
			}

			// Copy string pointers to correct position.
			memcpy(strings+pos, *it, block_items*sizeof(unsigned char*));

			// Return block for later use. Favor those in the
			// temporary space.
			if (*it >= strings && *it < strings+n) {
				freeblocks.push_back(*it);
			} else {
				freeblocks.push_front(*it);
			}

			pos += block_items;
		}
	}
	freeblocks.clear();
	backlinks.clear();
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<B>(strings+pos, bucketsize[i], depth+1);
		pos += bucketsize[i];
	}
}